

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
Am_Demon_Set::Set_Object_Demon(Am_Demon_Set *this,Am_Object_Demon_Type type,Am_Object_Demon *demon)

{
  Am_Object_Demon *demon_local;
  Am_Object_Demon_Type type_local;
  Am_Demon_Set *this_local;
  
  if (type == Am_CREATE_OBJ) {
    this->data->create_demon = demon;
  }
  else if (type == Am_COPY_OBJ) {
    this->data->copy_demon = demon;
  }
  else if (type == Am_DESTROY_OBJ) {
    this->data->destroy_demon = demon;
  }
  return;
}

Assistant:

void
Am_Demon_Set::Set_Object_Demon(Am_Object_Demon_Type type,
                               Am_Object_Demon *demon)
{
  switch (type) {
  case Am_CREATE_OBJ:
    data->create_demon = demon;
    break;
  case Am_COPY_OBJ:
    data->copy_demon = demon;
    break;
  case Am_DESTROY_OBJ:
    data->destroy_demon = demon;
    break;
  }
}